

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Statements(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
             *this,bool t_class_allowed)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  eval_error *peVar6;
  bool bVar7;
  Depth_Counter dc;
  allocator<char> local_65;
  uint local_64;
  Depth_Counter local_60;
  File_Position local_58;
  string local_50;
  
  Depth_Counter::Depth_Counter(&local_60,this);
  local_64 = (uint)t_class_allowed;
  bVar3 = true;
  bVar4 = false;
  do {
    while( true ) {
      bVar7 = bVar4;
      iVar1 = (this->m_position).line;
      iVar2 = (this->m_position).col;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"",(allocator<char> *)&local_58);
      bVar4 = Def(this,false,&local_50);
      local_58.line = iVar1;
      local_58.column = iVar2;
      if (bVar4) break;
      bVar4 = Try(this);
      if (bVar4) break;
      bVar4 = If(this);
      if (bVar4) break;
      bVar4 = While(this);
      if (bVar4) break;
      bVar4 = Class(this,SUB41(local_64,0));
      if (bVar4) break;
      bVar4 = For(this);
      if (bVar4) break;
      bVar4 = Switch(this);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar4) goto LAB_0055b273;
      bVar4 = Return(this);
      if (bVar4) {
LAB_0055b2d2:
        bVar7 = !bVar3;
        bVar3 = false;
        bVar4 = true;
        if (bVar7) {
          peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Two expressions missing line separator",&local_65);
          exception::eval_error::eval_error
                    (peVar6,&local_50,&local_58,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
      }
      else {
        bVar4 = Break(this);
        if (bVar4) goto LAB_0055b2d2;
        bVar4 = Continue(this);
        if (bVar4) goto LAB_0055b2d2;
        bVar4 = Equation(this);
        if (bVar4) goto LAB_0055b2d2;
        bVar5 = Block(this);
        bVar3 = true;
        bVar4 = true;
        if (!bVar5) {
          bVar5 = Eol(this);
          bVar3 = true;
          bVar4 = true;
          if (!bVar5) {
            (local_60.parser)->m_current_parse_depth = (local_60.parser)->m_current_parse_depth - 1;
            return bVar7;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
LAB_0055b273:
    bVar7 = !bVar3;
    bVar3 = true;
    bVar4 = true;
    if (bVar7) {
      peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Two function definitions missing line separator",&local_65);
      exception::eval_error::eval_error
                (peVar6,&local_50,&local_58,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
  } while( true );
}

Assistant:

bool Statements(const bool t_class_allowed = false) {
        Depth_Counter dc{this};
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def() || Try() || If() || While() || Class(t_class_allowed) || For() || Switch()) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator",
                                          File_Position(start.line, start.col),
                                          *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Return() || Break() || Continue() || Equation()) {
            if (!saw_eol) {
              throw exception::eval_error("Two expressions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = false;
          } else if (Block() || Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }